

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINGetFuncNorm(void *kinmem,sunrealtype *funcnorm)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,0x3fa,"KINGetFuncNorm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
  }
  else {
    *funcnorm = *(sunrealtype *)((long)kinmem + 0x250);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetFuncNorm(void* kinmem, sunrealtype* funcnorm)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem   = (KINMem)kinmem;
  *funcnorm = kin_mem->kin_fnorm;

  return (KIN_SUCCESS);
}